

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_tunnel(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  square_conflict *psVar3;
  _Bool local_1d;
  int local_1c;
  _Bool more;
  loc_conflict lStack_18;
  wchar_t dir;
  loc_conflict grid;
  command *cmd_local;
  
  local_1d = false;
  grid = (loc_conflict)cmd;
  wVar2 = cmd_get_direction(cmd,"direction",&local_1c,false);
  if (wVar2 == L'\0') {
    lStack_18 = (loc_conflict)loc_sum(player->grid,ddgrid[local_1c]);
    _Var1 = do_cmd_tunnel_test(player,lStack_18);
    if (_Var1) {
      player->upkeep->energy_use = (uint)z_info->move_energy;
      _Var1 = player_confuse_dir(player,&local_1c,false);
      if (_Var1) {
        lStack_18 = (loc_conflict)loc_sum(player->grid,ddgrid[local_1c]);
      }
      psVar3 = square((chunk *)cave,lStack_18);
      if (psVar3->mon < 1) {
        local_1d = do_cmd_tunnel_aux(lStack_18);
      }
      else {
        msg("There is a monster in the way!");
        py_attack(player,lStack_18);
      }
      if (local_1d == false) {
        disturb(player);
      }
    }
    else {
      disturb(player);
    }
  }
  return;
}

Assistant:

void do_cmd_tunnel(struct command *cmd)
{
	struct loc grid;
	int dir;
	bool more = false;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false))
		return;

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Oops */
	if (!do_cmd_tunnel_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Attack any monster we run into */
	if (square(cave, grid)->mon > 0) {
		msg("There is a monster in the way!");
		py_attack(player, grid);
	} else {
		/* Tunnel through walls */
		more = do_cmd_tunnel_aux(grid);
	}

	/* Cancel repetition unless we can continue */
	if (!more) disturb(player);
}